

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validate_cfg.cpp
# Opt level: O2

spv_result_t
spvtools::val::ValidateStructuredSelections
          (ValidationState_t *_,
          vector<const_spvtools::val::BasicBlock_*,_std::allocator<const_spvtools::val::BasicBlock_*>_>
          *postorder)

{
  uint16_t uVar1;
  BasicBlock *pBVar2;
  Instruction *inst;
  byte bVar3;
  ulong index;
  Instruction *this;
  size_t index_00;
  char *pcVar4;
  __normal_iterator<const_spvtools::val::BasicBlock_*const_*,_std::vector<const_spvtools::val::BasicBlock_*,_std::allocator<const_spvtools::val::BasicBlock_*>_>_>
  __tmp;
  pointer ppBVar5;
  __ireturn_type _Var6;
  __ireturn_type _Var7;
  uint false_label;
  uint true_label;
  ValidationState_t *local_250;
  vector<const_spvtools::val::BasicBlock_*,_std::allocator<const_spvtools::val::BasicBlock_*>_>
  *local_248;
  unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
  seen;
  uint target;
  spv_result_t local_38;
  
  seen._M_h._M_buckets = &seen._M_h._M_single_bucket;
  seen._M_h._M_bucket_count = 1;
  seen._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  seen._M_h._M_element_count = 0;
  seen._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  seen._M_h._M_rehash_policy._M_next_resize = 0;
  seen._M_h._M_single_bucket = (__node_base_ptr)0x0;
  ppBVar5 = (postorder->
            super__Vector_base<const_spvtools::val::BasicBlock_*,_std::allocator<const_spvtools::val::BasicBlock_*>_>
            )._M_impl.super__Vector_impl_data._M_finish;
  local_250 = _;
  local_248 = postorder;
LAB_001938c8:
  do {
    do {
      do {
        if (ppBVar5 ==
            (local_248->
            super__Vector_base<const_spvtools::val::BasicBlock_*,_std::allocator<const_spvtools::val::BasicBlock_*>_>
            )._M_impl.super__Vector_impl_data._M_start) {
          local_38 = SPV_SUCCESS;
          goto LAB_00193a21;
        }
        pBVar2 = ppBVar5[-1];
        ppBVar5 = ppBVar5 + -1;
        inst = pBVar2->terminator_;
      } while (inst == (Instruction *)0x0);
      this = inst + -1;
      uVar1 = inst[-1].inst_.opcode;
      if (uVar1 == 0xf6) {
        target = Instruction::GetOperandAs<unsigned_int>(this,0);
        std::__detail::
        _Insert<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>,_true>
        ::insert((_Insert<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>,_true>
                  *)&seen,&target);
        index_00 = 1;
LAB_00193927:
        target = Instruction::GetOperandAs<unsigned_int>(this,index_00);
        std::__detail::
        _Insert<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>,_true>
        ::insert((_Insert<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>,_true>
                  *)&seen,&target);
      }
      else {
        if (uVar1 == 0xf7) {
          index_00 = 0;
          goto LAB_00193927;
        }
        this = (Instruction *)0x0;
      }
    } while (pBVar2->structurally_reachable_ != true);
    uVar1 = (inst->inst_).opcode;
    if (uVar1 != 0xfb) {
      if (uVar1 == 0xfa) {
        true_label = Instruction::GetOperandAs<unsigned_int>(inst,1);
        false_label = Instruction::GetOperandAs<unsigned_int>(inst,2);
        _Var6 = std::__detail::
                _Insert_base<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                ::insert((_Insert_base<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                          *)&seen,&true_label);
        _Var7 = std::__detail::
                _Insert_base<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                ::insert((_Insert_base<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                          *)&seen,&false_label);
        if (this == (Instruction *)0x0) {
          bVar3 = _Var6.second & _Var7.second & 1;
        }
        else {
          bVar3 = (this->inst_).opcode == 0xf6 & _Var6.second & _Var7.second;
        }
        if (bVar3 != 0) {
          ValidationState_t::diag((DiagnosticStream *)&target,local_250,SPV_ERROR_INVALID_CFG,inst);
          pcVar4 = "Selection must be structured";
LAB_00193a5f:
          std::operator<<((ostream *)&target,pcVar4);
          DiagnosticStream::~DiagnosticStream((DiagnosticStream *)&target);
LAB_00193a21:
          std::
          _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
          ::~_Hashtable(&seen._M_h);
          return local_38;
        }
      }
      goto LAB_001938c8;
    }
    if (this == (Instruction *)0x0) {
      ValidationState_t::diag((DiagnosticStream *)&target,local_250,SPV_ERROR_INVALID_CFG,inst);
      pcVar4 = "OpSwitch must be preceded by an OpSelectionMerge instruction";
      goto LAB_00193a5f;
    }
    for (index = 1;
        index < (ulong)((long)(inst->operands_).
                              super__Vector_base<spv_parsed_operand_t,_std::allocator<spv_parsed_operand_t>_>
                              ._M_impl.super__Vector_impl_data._M_finish -
                        (long)(inst->operands_).
                              super__Vector_base<spv_parsed_operand_t,_std::allocator<spv_parsed_operand_t>_>
                              ._M_impl.super__Vector_impl_data._M_start >> 4);
        index = (ulong)((int)index + 2)) {
      target = Instruction::GetOperandAs<unsigned_int>(inst,index);
      std::__detail::
      _Insert_base<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
      ::insert((_Insert_base<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                *)&seen,&target);
    }
  } while( true );
}

Assistant:

spv_result_t ValidateStructuredSelections(
    ValidationState_t& _, const std::vector<const BasicBlock*>& postorder) {
  std::unordered_set<uint32_t> seen;
  for (auto iter = postorder.rbegin(); iter != postorder.rend(); ++iter) {
    const auto* block = *iter;
    const auto* terminator = block->terminator();
    if (!terminator) continue;
    const auto index = terminator - &_.ordered_instructions()[0];
    auto* merge = &_.ordered_instructions()[index - 1];
    // Marks merges and continues as seen.
    if (merge->opcode() == spv::Op::OpSelectionMerge) {
      seen.insert(merge->GetOperandAs<uint32_t>(0));
    } else if (merge->opcode() == spv::Op::OpLoopMerge) {
      seen.insert(merge->GetOperandAs<uint32_t>(0));
      seen.insert(merge->GetOperandAs<uint32_t>(1));
    } else {
      // Only track the pointer if it is a merge instruction.
      merge = nullptr;
    }

    // Skip unreachable blocks.
    if (!block->structurally_reachable()) continue;

    if (terminator->opcode() == spv::Op::OpBranchConditional) {
      const auto true_label = terminator->GetOperandAs<uint32_t>(1);
      const auto false_label = terminator->GetOperandAs<uint32_t>(2);
      // Mark the upcoming blocks as seen now, but only error out if this block
      // was missing a merge instruction and both labels hadn't been seen
      // previously.
      const bool true_label_unseen = seen.insert(true_label).second;
      const bool false_label_unseen = seen.insert(false_label).second;
      if ((!merge || merge->opcode() == spv::Op::OpLoopMerge) &&
          true_label_unseen && false_label_unseen) {
        return _.diag(SPV_ERROR_INVALID_CFG, terminator)
               << "Selection must be structured";
      }
    } else if (terminator->opcode() == spv::Op::OpSwitch) {
      if (!merge) {
        return _.diag(SPV_ERROR_INVALID_CFG, terminator)
               << "OpSwitch must be preceded by an OpSelectionMerge "
                  "instruction";
      }
      // Mark the targets as seen.
      for (uint32_t i = 1; i < terminator->operands().size(); i += 2) {
        const auto target = terminator->GetOperandAs<uint32_t>(i);
        seen.insert(target);
      }
    }
  }

  return SPV_SUCCESS;
}